

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * __thiscall
fmt::v10::detail::
format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::on_format_specs(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,int id,char *begin,char *param_3)

{
  size_t *psVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (this->context_).super_basic_format_parse_context<char>.format_str_.data_;
  lVar3 = (long)begin - (long)pcVar2;
  if (lVar3 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                ,0x189,"negative value");
  }
  (this->context_).super_basic_format_parse_context<char>.format_str_.data_ = pcVar2 + lVar3;
  psVar1 = &(this->context_).super_basic_format_parse_context<char>.format_str_.size_;
  *psVar1 = *psVar1 - lVar3;
  if ((uint)id < 3) {
    pcVar2 = (*this->parse_funcs_[(uint)id])(&this->context_);
    return pcVar2;
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR auto on_format_specs(int id, const Char* begin, const Char*)
      -> const Char* {
    context_.advance_to(begin);
    // id >= 0 check is a workaround for gcc 10 bug (#2065).
    return id >= 0 && id < num_args ? parse_funcs_[id](context_) : begin;
  }